

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O3

int Gia_ManFilterEquivsUsingParts(Gia_Man_t *pGia,char *pName1,char *pName2)

{
  Gia_Rpr_t GVar1;
  uint uVar2;
  uint uVar3;
  int *piVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  Gia_Man_t *p0;
  Gia_Man_t *p1;
  Gia_Man_t *p;
  long lVar8;
  Vec_Int_t *p_00;
  ulong uVar9;
  long lVar10;
  uint *puVar11;
  ulong uVar12;
  char *pcVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  Gia_Obj_t *pGVar18;
  
  if ((pGia->pReprs == (Gia_Rpr_t *)0x0) || (pGia->pNexts == (int *)0x0)) {
    pcVar13 = "Equivalences are not defined.\n";
LAB_002046f0:
    Abc_Print(1,pcVar13);
  }
  else {
    p0 = Gia_AigerRead(pName1,0,0,0);
    if (p0 == (Gia_Man_t *)0x0) {
      pcVar13 = "Cannot read first file %s.\n";
      pName2 = pName1;
    }
    else {
      p1 = Gia_AigerRead(pName2,0,0,0);
      if (p1 != (Gia_Man_t *)0x0) {
        p = Gia_ManMiter(p0,p1,0,0,1,0,0);
        if (p == (Gia_Man_t *)0x0) {
          Gia_ManStop(p0);
          Gia_ManStop(p1);
          pcVar13 = "Cannot create sequential miter.\n";
        }
        else if (pGia->nObjs == p->nObjs) {
          iVar7 = bcmp(pGia->pObjs,p->pObjs,(long)pGia->nObjs * 0xc);
          if (iVar7 == 0) {
            Gia_ManCleanMark0(pGia);
            iVar7 = p0->nObjs;
            if (iVar7 < 1) {
              pGVar18 = (Gia_Obj_t *)0x0;
            }
            else {
              lVar8 = 8;
              lVar10 = 0;
              pGVar18 = (Gia_Obj_t *)0x0;
              do {
                if (p0->pObjs == (Gia_Obj_t *)0x0) break;
                uVar14 = *(uint *)(&p0->pObjs->field_0x0 + lVar8);
                if (uVar14 != 0xffffffff) {
                  if ((int)uVar14 < 0) goto LAB_00204bb6;
                  uVar14 = uVar14 >> 1;
                  if ((p->nObjs <= (int)uVar14) || (pGia->nObjs <= (int)uVar14)) goto LAB_00204b78;
                  pGVar18 = pGia->pObjs + uVar14;
                  *(ulong *)pGVar18 = *(ulong *)pGVar18 | 0x40000000;
                  iVar7 = p0->nObjs;
                }
                lVar10 = lVar10 + 1;
                lVar8 = lVar8 + 0xc;
              } while (lVar10 < iVar7);
            }
            Gia_ManCleanMark1(pGia);
            iVar7 = p1->nObjs;
            if (0 < iVar7) {
              lVar8 = 8;
              lVar10 = 0;
              do {
                if (p1->pObjs == (Gia_Obj_t *)0x0) break;
                uVar14 = *(uint *)(&p1->pObjs->field_0x0 + lVar8);
                if (uVar14 != 0xffffffff) {
                  if ((int)uVar14 < 0) {
LAB_00204bb6:
                    __assert_fail("Lit >= 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                                  ,0x12f,"int Abc_Lit2Var(int)");
                  }
                  uVar14 = uVar14 >> 1;
                  if ((p->nObjs <= (int)uVar14) || (pGia->nObjs <= (int)uVar14)) {
LAB_00204b78:
                    __assert_fail("v >= 0 && v < p->nObjs",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
                  }
                  pGVar18 = pGia->pObjs + uVar14;
                  *(ulong *)pGVar18 = *(ulong *)pGVar18 | 0x4000000000000000;
                  iVar7 = p1->nObjs;
                }
                lVar10 = lVar10 + 1;
                lVar8 = lVar8 + 0xc;
              } while (lVar10 < iVar7);
            }
            iVar7 = pGia->nObjs;
            uVar14 = 0;
            uVar16 = 0;
            if (1 < iVar7) {
              lVar8 = 1;
              lVar10 = 0xc;
              uVar14 = 0;
              do {
                GVar1 = pGia->pReprs[lVar8];
                if (((uint)GVar1 & 0xfffffff) == 0) {
                  if (pGia->pNexts[lVar8] != 0) {
                    __assert_fail("pGia->pNexts[i] == 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                                  ,0x973,
                                  "int Gia_ManFilterEquivsUsingParts(Gia_Man_t *, char *, char *)");
                  }
                  uVar14 = uVar14 + 1;
                  pGVar18 = (Gia_Obj_t *)(&pGia->pObjs->field_0x0 + lVar10);
                  if ((*(ulong *)pGVar18 & 0x4000000040000000) == 0x4000000040000000) {
                    pGia->pReprs[lVar8] = (Gia_Rpr_t)((uint)GVar1 | 0xfffffff);
                    iVar7 = pGia->nObjs;
                  }
                  else {
                    if ((*(ulong *)pGVar18 & 0x4000000040000000) == 0) {
                      __assert_fail("pObj->fMark0 || pObj->fMark1",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                                    ,0x974,
                                    "int Gia_ManFilterEquivsUsingParts(Gia_Man_t *, char *, char *)"
                                   );
                    }
                    uVar16 = uVar16 + 1;
                  }
                }
                lVar8 = lVar8 + 1;
                lVar10 = lVar10 + 0xc;
              } while (lVar8 < iVar7);
            }
            p_00 = Vec_IntAlloc(100);
            if (1 < pGia->nObjs) {
              uVar17 = 1;
              do {
                if (((~(uint)pGia->pReprs[uVar17] & 0xfffffff) == 0) && (0 < pGia->pNexts[uVar17]))
                {
                  if (((undefined1  [12])*pGVar18 & (undefined1  [12])0x4000000040000000) ==
                      (undefined1  [12])0x0) {
                    __assert_fail("pObj->fMark0 || pObj->fMark1",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                                  ,0x97f,
                                  "int Gia_ManFilterEquivsUsingParts(Gia_Man_t *, char *, char *)");
                  }
                  p_00->nSize = 0;
                  uVar14 = uVar14 - 1;
                  bVar6 = false;
                  bVar5 = false;
                  uVar12 = uVar17 & 0xffffffff;
                  do {
                    iVar7 = (int)uVar12;
                    if (pGia->nObjs <= iVar7) goto LAB_00204b78;
                    pGVar18 = pGia->pObjs + uVar12;
                    uVar9 = *(ulong *)pGVar18;
                    if ((uVar9 & 0x4000000040000000) == 0x40000000) {
                      Vec_IntPush(p_00,iVar7);
                      uVar9 = *(ulong *)pGVar18;
                      bVar5 = true;
                    }
                    if ((uVar9 & 0x4000000040000000) == 0x4000000000000000) {
                      Vec_IntPush(p_00,iVar7);
                      bVar6 = true;
                    }
                    uVar2 = pGia->pNexts[uVar12];
                    uVar12 = (ulong)uVar2;
                    uVar14 = uVar14 + 1;
                  } while (0 < (int)uVar2);
                  puVar11 = (uint *)(pGia->pNexts + uVar17);
                  uVar12 = uVar17 & 0xffffffff;
                  do {
                    uVar2 = *puVar11;
                    pGia->pReprs[(int)uVar12] =
                         (Gia_Rpr_t)((uint)pGia->pReprs[(int)uVar12] | 0xfffffff);
                    piVar4 = pGia->pNexts;
                    piVar4[(int)uVar12] = 0;
                    puVar11 = (uint *)(piVar4 + (int)uVar2);
                    uVar12 = (ulong)uVar2;
                  } while ((long)(int)uVar2 != 0);
                  if (((~(uint)pGia->pReprs[uVar17] & 0xfffffff) == 0) && (0 < piVar4[uVar17])) {
                    __assert_fail("!Gia_ObjIsHead(pGia, i)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                                  ,0x998,
                                  "int Gia_ManFilterEquivsUsingParts(Gia_Man_t *, char *, char *)");
                  }
                  if (bVar6 && bVar5) {
                    iVar7 = p_00->nSize;
                    if (1 < (long)iVar7) {
                      puVar11 = (uint *)p_00->pArray;
                      uVar2 = *puVar11;
                      uVar16 = (uVar16 + iVar7) - 1;
                      lVar8 = 1;
                      uVar15 = uVar2;
                      do {
                        uVar3 = puVar11[lVar8];
                        if ((uVar2 != 0xfffffff) && ((int)uVar3 <= (int)uVar2)) {
                          __assert_fail("Num == GIA_VOID || Num < Id",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                                        ,0x401,"void Gia_ObjSetRepr(Gia_Man_t *, int, int)");
                        }
                        pGia->pReprs[(int)uVar3] =
                             (Gia_Rpr_t)
                             ((uint)pGia->pReprs[(int)uVar3] & 0xf0000000 | uVar2 & 0xfffffff);
                        piVar4 = pGia->pNexts;
                        piVar4[(int)uVar15] = uVar3;
                        lVar8 = lVar8 + 1;
                        uVar15 = uVar3;
                      } while (iVar7 != lVar8);
                      if (piVar4[(int)uVar3] != 0) {
                        __assert_fail("Gia_ObjNext(pGia, iPrev) == 0",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                                      ,0x9a4,
                                      "int Gia_ManFilterEquivsUsingParts(Gia_Man_t *, char *, char *)"
                                     );
                      }
                    }
                  }
                }
                uVar17 = uVar17 + 1;
              } while ((long)uVar17 < (long)pGia->nObjs);
            }
            Vec_IntFree(p_00);
            Abc_Print(1,"The number of literals: Before = %d. After = %d.\n",(ulong)uVar14,
                      (ulong)uVar16);
            Gia_ManCleanMark0(pGia);
            Gia_ManCleanMark1(pGia);
            return 1;
          }
          Gia_ManStop(p0);
          Gia_ManStop(p1);
          Gia_ManStop(p);
          pcVar13 = "The AIG structure of the miter does not match.\n";
        }
        else {
          Gia_ManStop(p0);
          Gia_ManStop(p1);
          Gia_ManStop(p);
          pcVar13 = "The number of objects in different.\n";
        }
        goto LAB_002046f0;
      }
      Gia_ManStop((Gia_Man_t *)0x0);
      pcVar13 = "Cannot read second file %s.\n";
    }
    Abc_Print(1,pcVar13,pName2);
  }
  return 0;
}

Assistant:

int Gia_ManFilterEquivsUsingParts( Gia_Man_t * pGia, char * pName1, char * pName2 )
{
    Vec_Int_t * vNodes;
    Gia_Man_t * pGia1, * pGia2, * pMiter;
    Gia_Obj_t * pObj1, * pObj2, * pObjM, * pObj = NULL;
    int i, k, iObj, iNext, iPrev, iRepr;
    int iLitsOld, iLitsNew;
    if ( pGia->pReprs == NULL || pGia->pNexts == NULL )
    {
        Abc_Print( 1, "Equivalences are not defined.\n" );
        return 0;
    }
    pGia1 = Gia_AigerRead( pName1, 0, 0, 0 );
    if ( pGia1 == NULL )
    {
        Abc_Print( 1, "Cannot read first file %s.\n", pName1 );
        return 0;
    }
    pGia2 = Gia_AigerRead( pName2, 0, 0, 0 );
    if ( pGia2 == NULL )
    {
        Gia_ManStop( pGia2 );
        Abc_Print( 1, "Cannot read second file %s.\n", pName2 );
        return 0;
    }
    pMiter = Gia_ManMiter( pGia1, pGia2, 0, 0, 1, 0, 0 );
    if ( pMiter == NULL )
    {
        Gia_ManStop( pGia1 );
        Gia_ManStop( pGia2 );
        Abc_Print( 1, "Cannot create sequential miter.\n" );
        return 0;
    }
    // make sure the miter is isomorphic
    if ( Gia_ManObjNum(pGia) != Gia_ManObjNum(pMiter) )
    {
        Gia_ManStop( pGia1 );
        Gia_ManStop( pGia2 );
        Gia_ManStop( pMiter );
        Abc_Print( 1, "The number of objects in different.\n" );
        return 0;
    }
    if ( memcmp( pGia->pObjs, pMiter->pObjs, sizeof(Gia_Obj_t) *  Gia_ManObjNum(pGia) ) )
    {
        Gia_ManStop( pGia1 );
        Gia_ManStop( pGia2 );
        Gia_ManStop( pMiter );
        Abc_Print( 1, "The AIG structure of the miter does not match.\n" );
        return 0;
    }
    // transfer copies
    Gia_ManCleanMark0( pGia );
    Gia_ManForEachObj( pGia1, pObj1, i )
    {
        if ( pObj1->Value == ~0 )
            continue;
        pObjM = Gia_ManObj( pMiter, Abc_Lit2Var(pObj1->Value) );
        pObj = Gia_ManObj( pGia, Gia_ObjId(pMiter, pObjM) );
        pObj->fMark0 = 1;
    }
    Gia_ManCleanMark1( pGia );
    Gia_ManForEachObj( pGia2, pObj2, i )
    {
        if ( pObj2->Value == ~0 )
            continue;
        pObjM = Gia_ManObj( pMiter, Abc_Lit2Var(pObj2->Value) );
        pObj = Gia_ManObj( pGia, Gia_ObjId(pMiter, pObjM) );
        pObj->fMark1 = 1;
    }

    // filter equivalences
    iLitsOld = iLitsNew = 0;
    Gia_ManForEachConst( pGia, i )
    {
        iLitsOld++;
        pObj = Gia_ManObj( pGia, i );
        assert( pGia->pNexts[i] == 0 );
        assert( pObj->fMark0 || pObj->fMark1 );
        if ( pObj->fMark0 && pObj->fMark1 ) // belongs to both A and B
            Gia_ObjUnsetRepr( pGia, i );
        else
            iLitsNew++;
    }
    // filter equivalences
    vNodes = Vec_IntAlloc( 100 );
    Gia_ManForEachClass( pGia, i )
    {
        int fSeenA = 0, fSeenB = 0;
        assert( pObj->fMark0 || pObj->fMark1 );
        Vec_IntClear( vNodes );
        Gia_ClassForEachObj( pGia, i, iObj )
        {
            pObj = Gia_ManObj( pGia, iObj );
            if ( pObj->fMark0 && !pObj->fMark1 )
            {
                fSeenA = 1;
                Vec_IntPush( vNodes, iObj );
            }
            if ( !pObj->fMark0 && pObj->fMark1 )
            {
                fSeenB = 1;
                Vec_IntPush( vNodes, iObj );
            }
            iLitsOld++;
        }
        iLitsOld--;
        // undo equivalence classes
        for ( iObj = i, iNext = Gia_ObjNext(pGia, iObj); iObj;
              iObj = iNext, iNext = Gia_ObjNext(pGia, iObj) )
        {
            Gia_ObjUnsetRepr( pGia, iObj );
            Gia_ObjSetNext( pGia, iObj, 0 );
        }
        assert( !Gia_ObjIsHead(pGia, i) );
        if ( fSeenA && fSeenB && Vec_IntSize(vNodes) > 1 )
        {
            // create new class
            iPrev = iRepr = Vec_IntEntry( vNodes, 0 );
            Vec_IntForEachEntryStart( vNodes, iObj, k, 1 )
            {
                Gia_ObjSetRepr( pGia, iObj, iRepr );
                Gia_ObjSetNext( pGia, iPrev, iObj );
                iPrev = iObj;
                iLitsNew++;
            }
            assert( Gia_ObjNext(pGia, iPrev) == 0 );
        }
    }
    Vec_IntFree( vNodes );
    Abc_Print( 1, "The number of literals: Before = %d. After = %d.\n", iLitsOld, iLitsNew );
//Gia_ManEquivPrintClasses( pGia, 1, 0 );

    Gia_ManCleanMark0( pGia );
    Gia_ManCleanMark1( pGia );
    return 1;
}